

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

Xt __thiscall cppforth::Forth::findDefinition(Forth *this,CAddr nameToFind,Cell nameLength)

{
  allocator<char> local_41;
  undefined1 local_40 [8];
  string Word1;
  Cell nameLength_local;
  CAddr nameToFind_local;
  Forth *this_local;
  
  if (nameLength == 0) {
    this_local._4_4_ = 0;
  }
  else {
    Word1.field_2._8_4_ = nameLength;
    Word1.field_2._12_4_ = nameToFind;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_40,(ulong)nameLength,' ',&local_41);
    std::allocator<char>::~allocator(&local_41);
    moveFromDataSpace(this,(string *)local_40,Word1.field_2._12_4_,(ulong)(uint)Word1.field_2._8_4_)
    ;
    this_local._4_4_ = findDefinition(this,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

Xt findDefinition(CAddr nameToFind, Cell nameLength) {
			if (nameLength == 0)
				return 0;
			std::string Word1(nameLength,' ');
			moveFromDataSpace(Word1, nameToFind, nameLength);
			return findDefinition(Word1);
			/* for (auto & c: Word1) c = toupper_ascii(static_cast<unsigned char>(c));
			for (auto i = definitions.rbegin(), iend=definitions.rend(); i != iend ; ++i) {
				auto& defn = *i;
				//if (!defn.isFindable())
				if (defn.isHidden())
					continue;
				auto& name = defn.name;
				if(nameLength==name.length() && Word1.compare(name)==0) {
					return defn.numberInVector; 
				}
			}
			return 0; */
		}